

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scl.c
# Opt level: O1

int Scl_CommandUpsize(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Abc_Frame_t *pAVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  Abc_Ntk_t *pAVar5;
  FILE *__s;
  SC_SizePars *pPars;
  size_t __size;
  char *pcVar6;
  char *pcVar7;
  SC_SizePars Pars;
  SC_SizePars local_88;
  Abc_Frame_t *local_40;
  Abc_Ntk_t *local_38;
  
  local_40 = pAbc;
  local_38 = Abc_FrameReadNtk(pAbc);
  local_88.nIters = 1000;
  local_88.nIterNoChange = 0x32;
  local_88.Window = 1;
  local_88.Ratio = 10;
  local_88.Notches = 1000;
  local_88.DelayUser = 0;
  local_88.DelayGap = 0;
  local_88.TimeOut = 0;
  local_88.BuffTreeEst = 0;
  local_88.BypassFreq = 0;
  local_88.fUseDept = 1;
  local_88.fDumpStats = 0;
  local_88.fUseWireLoads = 0;
  local_88.fVerbose = 0;
  local_88.fVeryVerbose = 0;
  Extra_UtilGetoptReset();
LAB_00425e62:
  while (iVar2 = Extra_UtilGetopt(argc,argv,"IJWRNDGTXBcsdvwh"), pAVar1 = local_40,
        iVar4 = globalUtilOptind, 0x62 < iVar2) {
    if (iVar2 < 0x73) {
      if (iVar2 == 99) {
        local_88.fUseWireLoads = local_88.fUseWireLoads ^ 1;
      }
      else {
        if (iVar2 != 100) goto switchD_00425e87_caseD_43;
        local_88.fDumpStats = local_88.fDumpStats ^ 1;
      }
    }
    else if (iVar2 == 0x73) {
      local_88.fUseDept = local_88.fUseDept ^ 1;
    }
    else if (iVar2 == 0x76) {
      local_88._52_8_ = local_88._52_8_ ^ 1;
    }
    else {
      if (iVar2 != 0x77) goto switchD_00425e87_caseD_43;
      local_88._52_8_ = local_88._52_8_ ^ 0x100000000;
    }
  }
  switch(iVar2) {
  case 0x42:
    if (argc <= globalUtilOptind) {
      pcVar6 = "Command line switch \"-B\" should be followed by a positive integer.\n";
      break;
    }
    uVar3 = atoi(argv[globalUtilOptind]);
    local_88.BypassFreq = uVar3;
LAB_00425ff0:
    globalUtilOptind = iVar4 + 1;
    if ((int)uVar3 < 0) {
switchD_00425e87_caseD_43:
      pAVar1 = local_40;
      fwrite("usage: upsize [-IJWRNDGTXB num] [-csdvwh]\n",0x2a,1,(FILE *)local_40->Err);
      fwrite("\t           selectively increases gate sizes on the critical path\n",0x42,1,
             (FILE *)pAVar1->Err);
      fprintf((FILE *)pAVar1->Err,
              "\t-I <num> : the number of upsizing iterations to perform [default = %d]\n",
              local_88._0_8_ & 0xffffffff);
      fprintf((FILE *)pAVar1->Err,
              "\t-J <num> : the number of iterations without improvement to stop [default = %d]\n",
              (ulong)local_88._0_8_ >> 0x20);
      fprintf((FILE *)pAVar1->Err,
              "\t-W <num> : delay window (in percent) of near-critical COs [default = %d]\n",
              local_88._8_8_ & 0xffffffff);
      fprintf((FILE *)pAVar1->Err,
              "\t-R <num> : ratio of critical nodes (in percent) to update [default = %d]\n",
              (ulong)local_88._8_8_ >> 0x20);
      fprintf((FILE *)pAVar1->Err,
              "\t-N <num> : limit on discrete upsizing steps at a node [default = %d]\n",
              (ulong)(uint)local_88.Notches);
      fprintf((FILE *)pAVar1->Err,
              "\t-D <num> : delay target set by the user, in picoseconds [default = %d]\n",
              (ulong)(uint)local_88.DelayUser);
      fprintf((FILE *)pAVar1->Err,
              "\t-G <num> : delay gap during updating, in picoseconds [default = %d]\n",
              (ulong)(uint)local_88.DelayGap);
      fprintf((FILE *)pAVar1->Err,"\t-T <num> : approximate timeout in seconds [default = %d]\n",
              (ulong)(uint)local_88.TimeOut);
      fprintf((FILE *)pAVar1->Err,"\t-X <num> : ratio for buffer tree estimation [default = %d]\n",
              (ulong)(uint)local_88.BuffTreeEst);
      fprintf((FILE *)pAVar1->Err,"\t-B <num> : frequency of bypass transforms [default = %d]\n",
              (ulong)(uint)local_88.BypassFreq);
      pcVar7 = "yes";
      pcVar6 = "yes";
      if (local_88.fUseWireLoads == 0) {
        pcVar6 = "no";
      }
      fprintf((FILE *)pAVar1->Err,
              "\t-c       : toggle using wire-loads if specified [default = %s]\n",pcVar6);
      pcVar6 = "yes";
      if (local_88.fUseDept == 0) {
        pcVar6 = "no";
      }
      fprintf((FILE *)pAVar1->Err,
              "\t-s       : toggle using slack based on departure times [default = %s]\n",pcVar6);
      pcVar6 = "yes";
      if (local_88.fDumpStats == 0) {
        pcVar6 = "no";
      }
      fprintf((FILE *)pAVar1->Err,
              "\t-d       : toggle dumping statistics into a file [default = %s]\n",pcVar6);
      pcVar6 = "yes";
      if (local_88.fVerbose == 0) {
        pcVar6 = "no";
      }
      fprintf((FILE *)pAVar1->Err,
              "\t-v       : toggle printing verbose information [default = %s]\n",pcVar6);
      if (local_88.fVeryVerbose == 0) {
        pcVar7 = "no";
      }
      fprintf((FILE *)pAVar1->Err,
              "\t-w       : toggle printing more verbose information [default = %s]\n",pcVar7);
      __s = (FILE *)pAVar1->Err;
      pcVar6 = "\t-h       : print the command usage\n";
      __size = 0x24;
LAB_004262d1:
      fwrite(pcVar6,__size,1,__s);
      return 1;
    }
    goto LAB_00425e62;
  case 0x43:
  case 0x45:
  case 0x46:
  case 0x48:
  case 0x4b:
  case 0x4c:
  case 0x4d:
  case 0x4f:
  case 0x50:
  case 0x51:
  case 0x53:
  case 0x55:
  case 0x56:
    goto switchD_00425e87_caseD_43;
  case 0x44:
    if (globalUtilOptind < argc) {
      uVar3 = atoi(argv[globalUtilOptind]);
      local_88.DelayUser = uVar3;
      goto LAB_00425ff0;
    }
    pcVar6 = "Command line switch \"-D\" should be followed by a positive integer.\n";
    break;
  case 0x47:
    if (globalUtilOptind < argc) {
      local_88.DelayGap = atoi(argv[globalUtilOptind]);
      globalUtilOptind = iVar4 + 1;
      goto LAB_00425e62;
    }
    pcVar6 = "Command line switch \"-G\" should be followed by a positive integer.\n";
    break;
  case 0x49:
    if (globalUtilOptind < argc) {
      uVar3 = atoi(argv[globalUtilOptind]);
      local_88.nIters = uVar3;
      goto LAB_00425ff0;
    }
    pcVar6 = "Command line switch \"-I\" should be followed by a positive integer.\n";
    break;
  case 0x4a:
    if (globalUtilOptind < argc) {
      uVar3 = atoi(argv[globalUtilOptind]);
      local_88.nIterNoChange = uVar3;
      goto LAB_00425ff0;
    }
    pcVar6 = "Command line switch \"-J\" should be followed by a positive integer.\n";
    break;
  case 0x4e:
    if (globalUtilOptind < argc) {
      uVar3 = atoi(argv[globalUtilOptind]);
      local_88.Notches = uVar3;
      goto LAB_00425ff0;
    }
    pcVar6 = "Command line switch \"-N\" should be followed by a positive integer.\n";
    break;
  case 0x52:
    if (globalUtilOptind < argc) {
      uVar3 = atoi(argv[globalUtilOptind]);
      local_88.Ratio = uVar3;
      goto LAB_00425ff0;
    }
    pcVar6 = "Command line switch \"-R\" should be followed by a positive integer.\n";
    break;
  case 0x54:
    if (globalUtilOptind < argc) {
      uVar3 = atoi(argv[globalUtilOptind]);
      local_88.TimeOut = uVar3;
      goto LAB_00425ff0;
    }
    pcVar6 = "Command line switch \"-T\" should be followed by a positive integer.\n";
    break;
  case 0x57:
    if (globalUtilOptind < argc) {
      uVar3 = atoi(argv[globalUtilOptind]);
      local_88.Window = uVar3;
      goto LAB_00425ff0;
    }
    pcVar6 = "Command line switch \"-W\" should be followed by a positive integer.\n";
    break;
  case 0x58:
    if (globalUtilOptind < argc) {
      uVar3 = atoi(argv[globalUtilOptind]);
      local_88.BuffTreeEst = uVar3;
      goto LAB_00425ff0;
    }
    pcVar6 = "Command line switch \"-X\" should be followed by a positive integer.\n";
    break;
  default:
    if (iVar2 == -1) {
      pAVar5 = Abc_FrameReadNtk(local_40);
      if (pAVar5 == (Abc_Ntk_t *)0x0) {
        __s = (FILE *)pAVar1->Err;
        pcVar6 = "There is no current network.\n";
        __size = 0x1d;
      }
      else {
        pAVar5 = Abc_FrameReadNtk(pAVar1);
        if (pAVar5->ntkFunc == ABC_FUNC_MAP) {
          pAVar5 = Abc_FrameReadNtk(pAVar1);
          iVar4 = Abc_SclCheckNtk(pAVar5,0);
          if (iVar4 != 0) {
            if ((pAVar1->pLibScl != (void *)0x0) &&
               (iVar4 = Abc_SclHasDelayInfo(pAVar1->pLibScl), iVar4 != 0)) {
              Abc_SclUpsizePerform((SC_Lib *)pAVar1->pLibScl,local_38,&local_88);
              return 0;
            }
            Abc_Print(-1,"Library delay info is not available.\n");
            return 1;
          }
          __s = (FILE *)pAVar1->Err;
          pcVar6 = "The current network is not in a topo order (run \"topo\").\n";
          __size = 0x39;
        }
        else {
          __s = (FILE *)pAVar1->Err;
          pcVar6 = "The current network is not mapped.\n";
          __size = 0x23;
        }
      }
      goto LAB_004262d1;
    }
    goto switchD_00425e87_caseD_43;
  }
  Abc_Print(-1,pcVar6);
  goto switchD_00425e87_caseD_43;
}

Assistant:

int Scl_CommandUpsize( Abc_Frame_t * pAbc, int argc, char **argv )
{
    SC_SizePars Pars, * pPars = &Pars;
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c;
    memset( pPars, 0, sizeof(SC_SizePars) );
    pPars->nIters        = 1000;
    pPars->nIterNoChange =   50;
    pPars->Window        =    1;
    pPars->Ratio         =   10;
    pPars->Notches       = 1000;
    pPars->DelayUser     =    0;
    pPars->DelayGap      =    0;
    pPars->TimeOut       =    0;
    pPars->BuffTreeEst   =    0;
    pPars->BypassFreq    =    0;
    pPars->fUseDept      =    1;
    pPars->fUseWireLoads =    0;
    pPars->fDumpStats    =    0;
    pPars->fVerbose      =    0;
    pPars->fVeryVerbose  =    0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "IJWRNDGTXBcsdvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nIters = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nIters < 0 ) 
                goto usage;
            break;
        case 'J':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-J\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nIterNoChange = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nIterNoChange < 0 ) 
                goto usage;
            break;
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->Window = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->Window < 0 ) 
                goto usage;
            break;
        case 'R':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-R\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->Ratio = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->Ratio < 0 ) 
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->Notches = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->Notches < 0 ) 
                goto usage;
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->DelayUser = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->DelayUser < 0 ) 
                goto usage;
            break;
        case 'G':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-G\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->DelayGap = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->TimeOut = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->TimeOut < 0 ) 
                goto usage;
            break;
        case 'X':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-X\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->BuffTreeEst = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->BuffTreeEst < 0 ) 
                goto usage;
            break;
        case 'B':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-B\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->BypassFreq = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->BypassFreq < 0 ) 
                goto usage;
            break;
        case 'c':
            pPars->fUseWireLoads ^= 1;
            break;
        case 's':
            pPars->fUseDept ^= 1;
            break;
        case 'd':
            pPars->fDumpStats ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'w':
            pPars->fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( Abc_FrameReadNtk(pAbc) == NULL )
    {
        fprintf( pAbc->Err, "There is no current network.\n" );
        return 1;
    }
    if ( !Abc_NtkHasMapping(Abc_FrameReadNtk(pAbc)) )
    {
        fprintf( pAbc->Err, "The current network is not mapped.\n" );
        return 1;
    }
    if ( !Abc_SclCheckNtk(Abc_FrameReadNtk(pAbc), 0) )
    {
        fprintf( pAbc->Err, "The current network is not in a topo order (run \"topo\").\n" );
        return 1;
    }
    if ( !pAbc->pLibScl || !Abc_SclHasDelayInfo(pAbc->pLibScl) )
    {
        Abc_Print( -1, "Library delay info is not available.\n" );
        return 1;
    }

    Abc_SclUpsizePerform( (SC_Lib *)pAbc->pLibScl, pNtk, pPars );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: upsize [-IJWRNDGTXB num] [-csdvwh]\n" );
    fprintf( pAbc->Err, "\t           selectively increases gate sizes on the critical path\n" );
    fprintf( pAbc->Err, "\t-I <num> : the number of upsizing iterations to perform [default = %d]\n", pPars->nIters );
    fprintf( pAbc->Err, "\t-J <num> : the number of iterations without improvement to stop [default = %d]\n", pPars->nIterNoChange );
    fprintf( pAbc->Err, "\t-W <num> : delay window (in percent) of near-critical COs [default = %d]\n", pPars->Window );
    fprintf( pAbc->Err, "\t-R <num> : ratio of critical nodes (in percent) to update [default = %d]\n", pPars->Ratio );
    fprintf( pAbc->Err, "\t-N <num> : limit on discrete upsizing steps at a node [default = %d]\n", pPars->Notches );
    fprintf( pAbc->Err, "\t-D <num> : delay target set by the user, in picoseconds [default = %d]\n", pPars->DelayUser );
    fprintf( pAbc->Err, "\t-G <num> : delay gap during updating, in picoseconds [default = %d]\n", pPars->DelayGap );
    fprintf( pAbc->Err, "\t-T <num> : approximate timeout in seconds [default = %d]\n", pPars->TimeOut );
    fprintf( pAbc->Err, "\t-X <num> : ratio for buffer tree estimation [default = %d]\n", pPars->BuffTreeEst );
    fprintf( pAbc->Err, "\t-B <num> : frequency of bypass transforms [default = %d]\n", pPars->BypassFreq );
    fprintf( pAbc->Err, "\t-c       : toggle using wire-loads if specified [default = %s]\n", pPars->fUseWireLoads? "yes": "no" );
    fprintf( pAbc->Err, "\t-s       : toggle using slack based on departure times [default = %s]\n", pPars->fUseDept? "yes": "no" );
    fprintf( pAbc->Err, "\t-d       : toggle dumping statistics into a file [default = %s]\n", pPars->fDumpStats? "yes": "no" );
    fprintf( pAbc->Err, "\t-v       : toggle printing verbose information [default = %s]\n", pPars->fVerbose? "yes": "no" );
    fprintf( pAbc->Err, "\t-w       : toggle printing more verbose information [default = %s]\n", pPars->fVeryVerbose? "yes": "no" );
    fprintf( pAbc->Err, "\t-h       : print the command usage\n");
    return 1;
}